

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

bool __thiscall
SQCompilation::CodegenVisitor::IsLocalConstant(CodegenVisitor *this,SQObject *name,SQObject *e)

{
  ulong uVar1;
  SQUnsignedInteger *pSVar2;
  SQObjectPtr *pSVar3;
  SQTable *this_00;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  SQObjectPtr val;
  SQObjectPtr local_58;
  SQObject local_48;
  SQObject *local_38;
  
  local_48._unVal.pTable = (SQTable *)0x0;
  local_48._type = OT_NULL;
  local_48._flags = '\0';
  local_48._5_3_ = 0;
  uVar1 = (ulong)(this->_scopedconsts)._size;
  local_38 = name;
  do {
    do {
      uVar6 = uVar1;
      if ((long)uVar6 < 1) goto LAB_00157d14;
      uVar1 = uVar6 - 1;
      pSVar3 = (this->_scopedconsts)._vals;
      uVar5 = uVar1 & 0xffffffff;
    } while (pSVar3[uVar5].super_SQObject._type == OT_NULL);
    this_00 = pSVar3[uVar5].super_SQObject._unVal.pTable;
    local_58.super_SQObject._type = local_38->_type;
    local_58.super_SQObject._flags = local_38->_flags;
    local_58.super_SQObject._5_3_ = *(undefined3 *)&local_38->field_0x5;
    local_58.super_SQObject._unVal = (SQObjectValue)(local_38->_unVal).pTable;
    if ((local_58.super_SQObject._0_8_ & 0x8000000) != 0) {
      pSVar2 = &((local_58.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar2 = *pSVar2 + 1;
    }
    bVar4 = SQTable::Get(this_00,&local_58,(SQObjectPtr *)&local_48);
    SQObjectPtr::~SQObjectPtr(&local_58);
  } while (!bVar4);
  e->_type = local_48._type;
  e->_flags = local_48._flags;
  *(undefined3 *)&e->field_0x5 = local_48._5_3_;
  e->_unVal = local_48._unVal;
  if ((pSVar3[uVar5].super_SQObject._flags & 1) != 0) {
    e->_flags = e->_flags | 1;
  }
LAB_00157d14:
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
  return 0 < (long)uVar6;
}

Assistant:

bool CodegenVisitor::IsLocalConstant(const SQObject &name, SQObject &e)
{
    SQObjectPtr val;
    for (SQInteger i = SQInteger(_scopedconsts.size()) - 1; i >= 0; --i) {
        SQObjectPtr &tbl = _scopedconsts[i];
        if (!sq_isnull(tbl) && _table(tbl)->Get(name, val)) {
            e = val;
            if (tbl._flags & SQOBJ_FLAG_IMMUTABLE)
                e._flags |= SQOBJ_FLAG_IMMUTABLE;
            return true;
        }
    }
    return false;
}